

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# deadlock_test.cpp
# Opt level: O0

void __thiscall
CheckedMutexTest_CyclicDeadlock_Test<yamc::checked::timed_mutex>::TestBody
          (CheckedMutexTest_CyclicDeadlock_Test<yamc::checked::timed_mutex> *this)

{
  anon_class_1_0_00000001 local_11;
  CheckedMutexTest_CyclicDeadlock_Test<yamc::checked::timed_mutex> *pCStack_10;
  anon_class_1_0_00000001 test_body;
  CheckedMutexTest_CyclicDeadlock_Test<yamc::checked::timed_mutex> *this_local;
  
  pCStack_10 = this;
  TestBody::anon_class_1_0_00000001::operator()(&local_11);
  return;
}

Assistant:

TYPED_TEST(CheckedMutexTest, CyclicDeadlock)
{
  auto test_body = []{
    yamc::test::barrier step(3);
    TypeParam mtx1;
    TypeParam mtx2;
    TypeParam mtx3;
    yamc::test::task_runner(3, [&](std::size_t id) {
      switch (id) {
      case 0:
        ASSERT_NO_THROW(mtx1.lock());
        step.await();
        EXPECT_NO_THROW(mtx2.lock());
        EXPECT_NO_THROW(mtx2.unlock());
        EXPECT_NO_THROW(mtx1.unlock());
        break;
      case 1:
        ASSERT_NO_THROW(mtx2.lock());
        step.await();
        EXPECT_NO_THROW(mtx3.lock());
        EXPECT_NO_THROW(mtx3.unlock());
        EXPECT_NO_THROW(mtx2.unlock());
        break;
      case 2:
        ASSERT_NO_THROW(mtx3.lock());
        step.await();
        WAIT_TICKS;
        EXPECT_CHECK_FAILURE_INNER({
          mtx1.lock();
        });
        EXPECT_NO_THROW(mtx3.unlock());
        break;
      }
    });
  };
  EXPECT_CHECK_FAILURE_OUTER(test_body());
}